

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::ComplexOptionType3::~ComplexOptionType3(ComplexOptionType3 *this)

{
  ComplexOptionType3 *this_local;
  
  ~ComplexOptionType3(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ComplexOptionType3::~ComplexOptionType3() {
  // @@protoc_insertion_point(destructor:proto2_unittest.ComplexOptionType3)
  SharedDtor(*this);
}